

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

Move<vk::Handle<(vk::HandleType)12>_> *
vkt::api::anon_unknown_1::BufferView::create
          (Move<vk::Handle<(vk::HandleType)12>_> *__return_storage_ptr__,Environment *env,
          Resources *res,Parameters *params)

{
  Move<vk::Handle<(vk::HandleType)12>_> *pMVar1;
  VkBufferViewCreateInfo local_38;
  
  local_38.sType = VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO;
  local_38.pNext = (void *)0x0;
  local_38.flags = 0;
  local_38.format = params->format;
  local_38.offset = params->offset;
  local_38.range = params->range;
  local_38.buffer.m_internal = (deUint64)res;
  pMVar1 = ::vk::createBufferView
                     (__return_storage_ptr__,env->vkd,env->device,&local_38,env->allocationCallbacks
                     );
  return pMVar1;
}

Assistant:

static Move<VkBufferView> create (const Environment& env, const Resources& res, const Parameters& params)
	{
		const VkBufferViewCreateInfo	bufferViewInfo	=
		{
			VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO,
			DE_NULL,
			(VkBufferViewCreateFlags)0,
			*res.buffer.object,
			params.format,
			params.offset,
			params.range
		};

		return createBufferView(env.vkd, env.device, &bufferViewInfo, env.allocationCallbacks);
	}